

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrMan.c
# Opt level: O3

void Pdr_ManStop(Pdr_Man_t *p)

{
  int *piVar1;
  void *__ptr;
  void **__ptr_00;
  Vec_Wec_t *__ptr_01;
  ulong uVar2;
  int iVar3;
  void *pvVar4;
  Aig_Man_t *pAVar5;
  uint level;
  Vec_Int_t *pVVar6;
  Vec_Ptr_t *pVVar7;
  long lVar8;
  Vec_Vec_t *__ptr_02;
  long lVar9;
  double dVar10;
  double dVar11;
  
  Gia_ManStopP(&p->pGia);
  Aig_ManCleanMarkAB(p->pAig);
  if (p->pPars->fVerbose != 0) {
    level = p->nCexesTotal;
    Abc_Print(level,
              "Block =%5d  Oblig =%6d  Clause =%6d  Call =%6d (sat=%.1f%%)  Cex =%4d  Start =%4d\n",
              ((double)p->nCallsS * 100.0) / (double)p->nCalls,(ulong)(uint)p->nBlocks,
              (ulong)(uint)p->nObligs,(ulong)(uint)p->nCubes,(ulong)(uint)p->nCalls,(ulong)level,
              (ulong)(uint)p->nStarts);
    Abc_Print(level,"%s =","SAT solving");
    dVar10 = 0.0;
    if (p->tTotal != 0) {
      dVar10 = ((double)p->tSat * 100.0) / (double)p->tTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->tSat / 1000000.0,dVar10);
    Abc_Print(level,"%s =","  unsat    ");
    dVar10 = 0.0;
    if (p->tTotal != 0) {
      dVar10 = ((double)p->tSatUnsat * 100.0) / (double)p->tTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->tSatUnsat / 1000000.0,dVar10);
    Abc_Print(level,"%s =","  sat      ");
    dVar10 = 0.0;
    if (p->tTotal != 0) {
      dVar10 = ((double)p->tSatSat * 100.0) / (double)p->tTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->tSatSat / 1000000.0,dVar10);
    Abc_Print(level,"%s =","Generalize ");
    dVar10 = 0.0;
    if (p->tTotal != 0) {
      dVar10 = ((double)p->tGeneral * 100.0) / (double)p->tTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->tGeneral / 1000000.0,dVar10);
    Abc_Print(level,"%s =","Push clause");
    dVar10 = 0.0;
    if (p->tTotal != 0) {
      dVar10 = ((double)p->tPush * 100.0) / (double)p->tTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->tPush / 1000000.0,dVar10);
    Abc_Print(level,"%s =","Ternary sim");
    dVar10 = 0.0;
    if (p->tTotal != 0) {
      dVar10 = ((double)p->tTsim * 100.0) / (double)p->tTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->tTsim / 1000000.0,dVar10);
    Abc_Print(level,"%s =","Containment");
    dVar10 = 0.0;
    if (p->tTotal != 0) {
      dVar10 = ((double)p->tContain * 100.0) / (double)p->tTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->tContain / 1000000.0,dVar10);
    Abc_Print(level,"%s =","CNF compute");
    dVar10 = 0.0;
    if (p->tTotal != 0) {
      dVar10 = ((double)p->tCnf * 100.0) / (double)p->tTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->tCnf / 1000000.0,dVar10);
    Abc_Print(level,"%s =","Refinement ");
    dVar10 = 0.0;
    if (p->tTotal != 0) {
      dVar10 = ((double)p->tAbs * 100.0) / (double)p->tTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->tAbs / 1000000.0,dVar10);
    Abc_Print(level,"%s =","TOTAL      ");
    dVar10 = (double)p->tTotal;
    dVar11 = 0.0;
    if (p->tTotal != 0) {
      dVar11 = (dVar10 * 100.0) / dVar10;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar10 / 1000000.0,dVar11);
    fflush(_stdout);
  }
  pVVar7 = p->vSolvers;
  if (0 < pVVar7->nSize) {
    lVar9 = 0;
    do {
      sat_solver_delete((sat_solver *)pVVar7->pArray[lVar9]);
      lVar9 = lVar9 + 1;
      pVVar7 = p->vSolvers;
    } while (lVar9 < pVVar7->nSize);
  }
  if (pVVar7->pArray != (void **)0x0) {
    free(pVVar7->pArray);
  }
  free(pVVar7);
  __ptr_02 = p->vClauses;
  uVar2 = (ulong)(uint)__ptr_02->nSize;
  if (0 < __ptr_02->nSize) {
    lVar9 = 0;
    do {
      if ((int)uVar2 <= lVar9) {
LAB_005fae4c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecVec.h"
                      ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
      }
      pvVar4 = __ptr_02->pArray[lVar9];
      if (0 < *(int *)((long)pvVar4 + 4)) {
        lVar8 = 0;
        do {
          Pdr_SetDeref(*(Pdr_Set_t **)(*(long *)((long)pvVar4 + 8) + lVar8 * 8));
          __ptr_02 = p->vClauses;
          uVar2 = (ulong)__ptr_02->nSize;
          if ((long)uVar2 <= lVar9) goto LAB_005fae4c;
          lVar8 = lVar8 + 1;
          pvVar4 = __ptr_02->pArray[lVar9];
        } while (lVar8 < *(int *)((long)pvVar4 + 4));
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (int)uVar2);
    if (0 < (int)uVar2) {
      lVar9 = 0;
      do {
        pvVar4 = __ptr_02->pArray[lVar9];
        if (pvVar4 != (void *)0x0) {
          if (*(void **)((long)pvVar4 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar4 + 8));
          }
          free(pvVar4);
          uVar2 = (ulong)(uint)__ptr_02->nSize;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < (int)uVar2);
    }
  }
  if (__ptr_02->pArray != (void **)0x0) {
    free(__ptr_02->pArray);
  }
  free(__ptr_02);
  Pdr_QueueStop(p);
  if (p->pOrder != (int *)0x0) {
    free(p->pOrder);
    p->pOrder = (int *)0x0;
  }
  pVVar6 = p->vActVars;
  piVar1 = pVVar6->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar6);
  Cnf_DataFree(p->pCnf1);
  pVVar6 = p->vVar2Reg;
  if (pVVar6 != (Vec_Int_t *)0x0) {
    if (pVVar6->pArray != (int *)0x0) {
      free(pVVar6->pArray);
      p->vVar2Reg->pArray = (int *)0x0;
      pVVar6 = p->vVar2Reg;
      if (pVVar6 == (Vec_Int_t *)0x0) goto LAB_005fa9d6;
    }
    free(pVVar6);
    p->vVar2Reg = (Vec_Int_t *)0x0;
  }
LAB_005fa9d6:
  Cnf_DataFree(p->pCnf2);
  pVVar6 = p->pvId2Vars;
  if (pVVar6 != (Vec_Int_t *)0x0) {
    pAVar5 = p->pAig;
    if (0 < pAVar5->vObjs->nSize) {
      lVar9 = 8;
      lVar8 = 0;
      do {
        pvVar4 = *(void **)((long)&pVVar6->nCap + lVar9);
        if (pvVar4 != (void *)0x0) {
          free(pvVar4);
          pVVar6 = p->pvId2Vars;
          *(undefined8 *)((long)&pVVar6->nCap + lVar9) = 0;
          pAVar5 = p->pAig;
        }
        lVar8 = lVar8 + 1;
        lVar9 = lVar9 + 0x10;
      } while (lVar8 < pAVar5->vObjs->nSize);
    }
    free(pVVar6);
    p->pvId2Vars = (Vec_Int_t *)0x0;
  }
  if (0 < (p->vVar2Ids).nSize) {
    lVar9 = 0;
    do {
      pvVar4 = (p->vVar2Ids).pArray[lVar9];
      __ptr = *(void **)((long)pvVar4 + 8);
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      free(pvVar4);
      lVar9 = lVar9 + 1;
    } while (lVar9 < (p->vVar2Ids).nSize);
  }
  __ptr_00 = (p->vVar2Ids).pArray;
  if (__ptr_00 != (void **)0x0) {
    free(__ptr_00);
    (p->vVar2Ids).pArray = (void **)0x0;
  }
  __ptr_01 = p->vVLits;
  if (__ptr_01 != (Vec_Wec_t *)0x0) {
    iVar3 = __ptr_01->nCap;
    pVVar6 = __ptr_01->pArray;
    if (iVar3 < 1) {
      if (pVVar6 != (Vec_Int_t *)0x0) goto LAB_005faadd;
    }
    else {
      lVar8 = 8;
      lVar9 = 0;
      do {
        pvVar4 = *(void **)((long)&pVVar6->nCap + lVar8);
        if (pvVar4 != (void *)0x0) {
          free(pvVar4);
          pVVar6 = __ptr_01->pArray;
          *(undefined8 *)((long)&pVVar6->nCap + lVar8) = 0;
          iVar3 = __ptr_01->nCap;
        }
        lVar9 = lVar9 + 1;
        lVar8 = lVar8 + 0x10;
      } while (lVar9 < iVar3);
LAB_005faadd:
      free(pVVar6);
    }
    free(__ptr_01);
    p->vVLits = (Vec_Wec_t *)0x0;
  }
  Cnf_ManStop(p->pCnfMan);
  pVVar6 = p->vAbsFlops;
  if (pVVar6 != (Vec_Int_t *)0x0) {
    if (pVVar6->pArray != (int *)0x0) {
      free(pVVar6->pArray);
      p->vAbsFlops->pArray = (int *)0x0;
      pVVar6 = p->vAbsFlops;
      if (pVVar6 == (Vec_Int_t *)0x0) goto LAB_005fab43;
    }
    free(pVVar6);
    p->vAbsFlops = (Vec_Int_t *)0x0;
  }
LAB_005fab43:
  pVVar6 = p->vMapFf2Ppi;
  if (pVVar6 != (Vec_Int_t *)0x0) {
    if (pVVar6->pArray != (int *)0x0) {
      free(pVVar6->pArray);
      p->vMapFf2Ppi->pArray = (int *)0x0;
      pVVar6 = p->vMapFf2Ppi;
      if (pVVar6 == (Vec_Int_t *)0x0) goto LAB_005fab8b;
    }
    free(pVVar6);
    p->vMapFf2Ppi = (Vec_Int_t *)0x0;
  }
LAB_005fab8b:
  pVVar6 = p->vMapPpi2Ff;
  if (pVVar6 != (Vec_Int_t *)0x0) {
    if (pVVar6->pArray != (int *)0x0) {
      free(pVVar6->pArray);
      p->vMapPpi2Ff->pArray = (int *)0x0;
      pVVar6 = p->vMapPpi2Ff;
      if (pVVar6 == (Vec_Int_t *)0x0) goto LAB_005fabd3;
    }
    free(pVVar6);
    p->vMapPpi2Ff = (Vec_Int_t *)0x0;
  }
LAB_005fabd3:
  if (p->pPars->fNewXSim != 0) {
    Txs3_ManStop(p->pTxs3);
  }
  pVVar6 = p->vPrio;
  if (pVVar6 != (Vec_Int_t *)0x0) {
    if (pVVar6->pArray != (int *)0x0) {
      free(pVVar6->pArray);
      p->vPrio->pArray = (int *)0x0;
      pVVar6 = p->vPrio;
      if (pVVar6 == (Vec_Int_t *)0x0) goto LAB_005fac30;
    }
    free(pVVar6);
    p->vPrio = (Vec_Int_t *)0x0;
  }
LAB_005fac30:
  pVVar6 = p->vLits;
  piVar1 = pVVar6->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar6);
  pVVar6 = p->vCiObjs;
  piVar1 = pVVar6->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar6);
  pVVar6 = p->vCoObjs;
  piVar1 = pVVar6->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar6);
  pVVar6 = p->vCiVals;
  piVar1 = pVVar6->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar6);
  pVVar6 = p->vCoVals;
  piVar1 = pVVar6->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar6);
  pVVar6 = p->vNodes;
  piVar1 = pVVar6->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar6);
  pVVar6 = p->vUndo;
  piVar1 = pVVar6->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar6);
  pVVar6 = p->vVisits;
  piVar1 = pVVar6->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar6);
  pVVar6 = p->vCi2Rem;
  piVar1 = pVVar6->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar6);
  pVVar6 = p->vRes;
  piVar1 = pVVar6->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar6);
  pVVar7 = p->vInfCubes;
  if (pVVar7 != (Vec_Ptr_t *)0x0) {
    if (pVVar7->pArray != (void **)0x0) {
      free(pVVar7->pArray);
      p->vInfCubes->pArray = (void **)0x0;
      pVVar7 = p->vInfCubes;
      if (pVVar7 == (Vec_Ptr_t *)0x0) goto LAB_005fad9a;
    }
    free(pVVar7);
    p->vInfCubes = (Vec_Ptr_t *)0x0;
  }
LAB_005fad9a:
  if (p->pTime4Outs != (abctime *)0x0) {
    free(p->pTime4Outs);
    p->pTime4Outs = (abctime *)0x0;
  }
  pVVar7 = p->vCexes;
  if (pVVar7 != (Vec_Ptr_t *)0x0) {
    iVar3 = pVVar7->nSize;
    if (0 < iVar3) {
      lVar9 = 0;
      do {
        if ((void *)0x2 < pVVar7->pArray[lVar9]) {
          free(pVVar7->pArray[lVar9]);
          iVar3 = pVVar7->nSize;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < iVar3);
    }
    if (pVVar7->pArray != (void **)0x0) {
      free(pVVar7->pArray);
    }
    free(pVVar7);
  }
  pAVar5 = p->pAig;
  if (pAVar5->pFanData != (int *)0x0) {
    Aig_ManFanoutStop(pAVar5);
    pAVar5 = p->pAig;
  }
  if (pAVar5->pTerSimData != (uint *)0x0) {
    free(pAVar5->pTerSimData);
    p->pAig->pTerSimData = (uint *)0x0;
  }
  free(p);
  return;
}

Assistant:

void Pdr_ManStop( Pdr_Man_t * p )
{
    Pdr_Set_t * pCla;
    sat_solver * pSat;
    int i, k;
    Gia_ManStopP( &p->pGia );
    Aig_ManCleanMarkAB( p->pAig );
    if ( p->pPars->fVerbose ) 
    {
        Abc_Print( 1, "Block =%5d  Oblig =%6d  Clause =%6d  Call =%6d (sat=%.1f%%)  Cex =%4d  Start =%4d\n", 
            p->nBlocks, p->nObligs, p->nCubes, p->nCalls, 100.0 * p->nCallsS / p->nCalls, p->nCexesTotal, p->nStarts );
        ABC_PRTP( "SAT solving", p->tSat,       p->tTotal );
        ABC_PRTP( "  unsat    ", p->tSatUnsat,  p->tTotal );
        ABC_PRTP( "  sat      ", p->tSatSat,    p->tTotal );
        ABC_PRTP( "Generalize ", p->tGeneral,   p->tTotal );
        ABC_PRTP( "Push clause", p->tPush,      p->tTotal );
        ABC_PRTP( "Ternary sim", p->tTsim,      p->tTotal );
        ABC_PRTP( "Containment", p->tContain,   p->tTotal );
        ABC_PRTP( "CNF compute", p->tCnf,       p->tTotal );
        ABC_PRTP( "Refinement ", p->tAbs,       p->tTotal );
        ABC_PRTP( "TOTAL      ", p->tTotal,     p->tTotal );
        fflush( stdout );
    }
//    Abc_Print( 1, "SS =%6d. SU =%6d. US =%6d. UU =%6d.\n", p->nCasesSS, p->nCasesSU, p->nCasesUS, p->nCasesUU );
    Vec_PtrForEachEntry( sat_solver *, p->vSolvers, pSat, i )
        sat_solver_delete( pSat );
    Vec_PtrFree( p->vSolvers );
    Vec_VecForEachEntry( Pdr_Set_t *, p->vClauses, pCla, i, k )
        Pdr_SetDeref( pCla );
    Vec_VecFree( p->vClauses );
    Pdr_QueueStop( p );
    ABC_FREE( p->pOrder );
    Vec_IntFree( p->vActVars );
    // static CNF
    Cnf_DataFree( p->pCnf1 );
    Vec_IntFreeP( &p->vVar2Reg );
    // dynamic CNF
    Cnf_DataFree( p->pCnf2 );
    if ( p->pvId2Vars )
    for ( i = 0; i < Aig_ManObjNumMax(p->pAig); i++ )
        ABC_FREE( p->pvId2Vars[i].pArray );
    ABC_FREE( p->pvId2Vars );
//    Vec_VecFreeP( (Vec_Vec_t **)&p->vVar2Ids );
    for ( i = 0; i < Vec_PtrSize(&p->vVar2Ids); i++ )
        Vec_IntFree( (Vec_Int_t *)Vec_PtrEntry(&p->vVar2Ids, i) );
    ABC_FREE( p->vVar2Ids.pArray );
    Vec_WecFreeP( &p->vVLits );
    // CNF manager
    Cnf_ManStop( p->pCnfMan );
    Vec_IntFreeP( &p->vAbsFlops );
    Vec_IntFreeP( &p->vMapFf2Ppi );
    Vec_IntFreeP( &p->vMapPpi2Ff );
    // terminary simulation
    if ( p->pPars->fNewXSim )
        Txs3_ManStop( p->pTxs3 );
    // internal use
    Vec_IntFreeP( &p->vPrio   );  // priority flops
    Vec_IntFree( p->vLits     );  // array of literals
    Vec_IntFree( p->vCiObjs   );  // cone leaves
    Vec_IntFree( p->vCoObjs   );  // cone roots
    Vec_IntFree( p->vCiVals   );  // cone leaf values
    Vec_IntFree( p->vCoVals   );  // cone root values
    Vec_IntFree( p->vNodes    );  // cone nodes
    Vec_IntFree( p->vUndo     );  // cone undos
    Vec_IntFree( p->vVisits   );  // intermediate
    Vec_IntFree( p->vCi2Rem   );  // CIs to be removed
    Vec_IntFree( p->vRes      );  // final result
    Vec_PtrFreeP( &p->vInfCubes );
    ABC_FREE( p->pTime4Outs );
    if ( p->vCexes )
        Vec_PtrFreeFree( p->vCexes );
    // additional AIG data-members
    if ( p->pAig->pFanData != NULL )
        Aig_ManFanoutStop( p->pAig );
    if ( p->pAig->pTerSimData != NULL )
        ABC_FREE( p->pAig->pTerSimData );
    ABC_FREE( p );
}